

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cSparseTexture2Tests.cpp
# Opt level: O2

bool __thiscall
gl4cts::SparseTexture2CommitmentTestCase::verifyTextureData
          (SparseTexture2CommitmentTestCase *this,Functions *gl,GLint target,GLint format,
          GLuint *texture,GLint level)

{
  GLint GVar1;
  GLint GVar2;
  uint uVar3;
  pointer __s;
  pointer puVar4;
  pointer pbVar5;
  _Alloc_hider _Var6;
  pointer __s_00;
  int iVar7;
  GLenum GVar8;
  int iVar9;
  ostream *poVar10;
  TestError *this_00;
  deUint32 dVar11;
  int iVar12;
  undefined4 in_register_0000000c;
  ulong uVar13;
  GLint z;
  size_type sVar14;
  ulong uVar15;
  SparseTexture2CommitmentTestCase *this_01;
  long lVar16;
  TokenStrings *this_02;
  int iVar17;
  int iVar18;
  int iVar19;
  ulong uVar20;
  GLint x;
  GLint y_1;
  int iVar21;
  bool bVar22;
  GLint depth;
  GLint height;
  GLint width;
  TransferFormat local_408;
  GLuint verifyTexture;
  TextureFormat *local_3f8;
  GLint local_3ec;
  size_type local_3e8;
  SparseTexture2CommitmentTestCase *local_3e0;
  ulong local_3d8;
  ostream *local_3d0;
  vector<unsigned_char,_std::allocator<unsigned_char>_> vecOutData;
  vector<unsigned_char,_std::allocator<unsigned_char>_> vecExpData;
  string local_378;
  ProgramSources sources;
  string local_288;
  string shader;
  TokenStrings s;
  ShaderProgram program;
  
  local_3d8 = CONCAT44(in_register_0000000c,format);
  local_3d0 = (ostream *)&(this->super_SparseTextureCommitmentTestCase).field_0x88;
  poVar10 = std::operator<<(local_3d0,"Verify Texture [level: ");
  poVar10 = (ostream *)std::ostream::operator<<(poVar10,level);
  std::operator<<(poVar10,"] - ");
  if ((this->super_SparseTextureCommitmentTestCase).mState.levels + -1 < level) {
    this_00 = (TestError *)__cxa_allocate_exception(0x38);
    tcu::TestError::TestError
              (this_00,"Invalid level",(char *)0x0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cSparseTexture2Tests.cpp"
               ,0x442);
    __cxa_throw(this_00,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
  }
  local_408 = glu::getTransferFormat((this->super_SparseTextureCommitmentTestCase).mState.format);
  local_3e8 = CONCAT44(local_3e8._4_4_,target);
  SparseTextureUtils::getTextureLevelSize
            (target,&(this->super_SparseTextureCommitmentTestCase).mState,level,&width,&height,
             &depth);
  GVar1 = depth;
  iVar7 = width / 2;
  bVar22 = true;
  if ((height != 0 && 2 < width + 1U) &&
     ((this->super_SparseTextureCommitmentTestCase).mState.minDepth <= depth)) {
    local_3f8 = &(this->super_SparseTextureCommitmentTestCase).mState.format;
    local_3e0 = (SparseTexture2CommitmentTestCase *)((ulong)local_408 >> 0x20);
    uVar3 = (uint)local_3e8;
    local_3ec = level;
    if ((uint)local_3e8 == 0x8513) {
      s.format.field_2._M_allocated_capacity = 0;
      s.format._M_dataplus._M_p = (pointer)0x0;
      s.format._M_string_length = 0;
      sources.sources[0].
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start =
           (pointer)CONCAT44(sources.sources[0].
                             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_start._4_4_,0x8515);
      std::vector<int,_std::allocator<int>_>::emplace_back<int>
                ((vector<int,_std::allocator<int>_> *)&s,(int *)&sources);
      sources.sources[0].
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start =
           (pointer)CONCAT44(sources.sources[0].
                             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_start._4_4_,0x8516);
      std::vector<int,_std::allocator<int>_>::emplace_back<int>
                ((vector<int,_std::allocator<int>_> *)&s,(int *)&sources);
      sources.sources[0].
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start =
           (pointer)CONCAT44(sources.sources[0].
                             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_start._4_4_,0x8517);
      std::vector<int,_std::allocator<int>_>::emplace_back<int>
                ((vector<int,_std::allocator<int>_> *)&s,(int *)&sources);
      sources.sources[0].
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start =
           (pointer)CONCAT44(sources.sources[0].
                             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_start._4_4_,0x8518);
      std::vector<int,_std::allocator<int>_>::emplace_back<int>
                ((vector<int,_std::allocator<int>_> *)&s,(int *)&sources);
      sources.sources[0].
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start =
           (pointer)CONCAT44(sources.sources[0].
                             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_start._4_4_,0x8519);
      std::vector<int,_std::allocator<int>_>::emplace_back<int>
                ((vector<int,_std::allocator<int>_> *)&s,(int *)&sources);
      sources.sources[0].
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start =
           (pointer)CONCAT44(sources.sources[0].
                             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_start._4_4_,0x851a);
      std::vector<int,_std::allocator<int>_>::emplace_back<int>
                ((vector<int,_std::allocator<int>_> *)&s,(int *)&sources);
      GVar2 = width;
      GVar1 = height;
      iVar9 = tcu::TextureFormat::getPixelSize(local_3f8);
      sources.sources[0].
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      sources.sources[0].
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      sources.sources[0].
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      program.m_shaders[0].super__Vector_base<glu::Shader_*,_std::allocator<glu::Shader_*>_>._M_impl
      .super__Vector_impl_data._M_start = (pointer)0x0;
      program.m_shaders[0].super__Vector_base<glu::Shader_*,_std::allocator<glu::Shader_*>_>._M_impl
      .super__Vector_impl_data._M_finish = (pointer)0x0;
      program.m_shaders[0].super__Vector_base<glu::Shader_*,_std::allocator<glu::Shader_*>_>._M_impl
      .super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      sVar14 = (size_type)(GVar1 * GVar2 * iVar9);
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
                ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&sources,sVar14);
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
                ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&program,sVar14);
      __s_00 = program.m_shaders[0].
               super__Vector_base<glu::Shader_*,_std::allocator<glu::Shader_*>_>._M_impl.
               super__Vector_impl_data._M_start;
      pbVar5 = sources.sources[0].
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      local_3e8 = sVar14;
      memset(sources.sources[0].
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start,0xff,sVar14);
      if (iVar7 < 1) {
        iVar7 = 0;
      }
      bVar22 = true;
      uVar13 = 0;
      do {
        if ((ulong)((long)(s.format._M_string_length - (long)s.format._M_dataplus._M_p) >> 2) <=
            uVar13) break;
        GVar8 = *(GLenum *)(s.format._M_dataplus._M_p + uVar13 * 4);
        local_3d8 = uVar13;
        poVar10 = std::operator<<(local_3d0,"Verify Subtarget [subtarget: ");
        poVar10 = (ostream *)std::ostream::operator<<(poVar10,GVar8);
        std::operator<<(poVar10,"] - ");
        memset(__s_00,0x7f,local_3e8);
        gl4cts::Texture::GetData(gl,local_3ec,GVar8,local_408.format,(GLenum)local_3e0,__s_00);
        GVar8 = (*gl->getError)();
        glu::checkError(GVar8,"Texture::GetData",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cSparseTexture2Tests.cpp"
                        ,0x490);
        for (iVar9 = 0; iVar9 != iVar7; iVar9 = iVar9 + 1) {
          for (iVar12 = 0; iVar12 < height; iVar12 = iVar12 + 1) {
            for (iVar21 = 0; iVar21 < depth; iVar21 = iVar21 + 1) {
              iVar17 = tcu::TextureFormat::getPixelSize(local_3f8);
              lVar16 = (long)((width * iVar12 + iVar9) * iVar17);
              iVar17 = bcmp((void *)((long)&(pbVar5->_M_dataplus)._M_p + lVar16),
                            (void *)(lVar16 + (long)__s_00),(long)iVar17);
              if (iVar17 != 0) {
                bVar22 = false;
              }
            }
          }
        }
        uVar13 = local_3d8 + 1;
      } while (bVar22);
      std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
                ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&program);
      std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
                ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&sources);
      std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
                ((_Vector_base<int,_std::allocator<int>_> *)&s);
    }
    else {
      if (((uint)local_3e8 == 0x9100) || ((uint)local_3e8 == 0x9102)) {
        if (((uint)local_3e8 | 2) != 0x9102) {
          return true;
        }
        vecExpData.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start = (pointer)0x0;
        vecExpData.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_finish = (pointer)0x0;
        vecExpData.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        vecOutData.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start = (pointer)0x0;
        vecOutData.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_finish = (pointer)0x0;
        vecOutData.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        sVar14 = (size_type)(height * width * depth);
        local_3e0 = this;
        std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize(&vecExpData,sVar14);
        std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize(&vecOutData,sVar14);
        puVar4 = vecExpData.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                 _M_impl.super__Vector_impl_data._M_start;
        __s = vecOutData.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
              super__Vector_impl_data._M_start;
        memset(vecExpData.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
               super__Vector_impl_data._M_start,0xff,sVar14);
        dVar11 = 0x8c1a;
        if (uVar3 == 0x9100) {
          dVar11 = 0xde1;
        }
        local_408.format = dVar11;
        gl4cts::Texture::Generate(gl,&verifyTexture);
        gl4cts::Texture::Bind(gl,verifyTexture,local_408.format);
        gl4cts::Texture::Storage(gl,local_408.format,1,0x8229,width,height,depth);
        GVar8 = (*gl->getError)();
        glu::checkError(GVar8,"Texture::Storage",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cSparseTexture2Tests.cpp"
                        ,0x4bb);
        if (iVar7 < 1) {
          iVar7 = 0;
        }
        iVar9 = 1;
        iVar12 = 0;
        while (bVar22 = SUB41(iVar9,0),
              iVar12 < (local_3e0->super_SparseTextureCommitmentTestCase).mState.samples) {
          local_3f8 = (TextureFormat *)CONCAT44(local_3f8._4_4_,iVar12);
          memset(__s,0,sVar14);
          gl4cts::Texture::Bind(gl,verifyTexture,local_408.format);
          gl4cts::Texture::SubImage
                    (gl,local_408.format,0,0,0,0,width,height,depth,0x1903,0x1401,__s);
          GVar8 = (*gl->getError)();
          glu::checkError(GVar8,"Texture::SubImage",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cSparseTexture2Tests.cpp"
                          ,0x4c4);
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&shader,st2_compute_textureVerify,(allocator<char> *)&s);
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_288,"image",(allocator<char> *)&sources);
          this_01 = (SparseTexture2CommitmentTestCase *)0x17f30d4;
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_378,"image",(allocator<char> *)&program);
          createShaderTokens(&s,this_01,(uint)local_3e8,(GLint)local_3d8,(GLint)local_3f8,&local_288
                             ,&local_378);
          std::__cxx11::string::~string((string *)&local_378);
          std::__cxx11::string::~string((string *)&local_288);
          replaceToken("<OUTPUT_TYPE>",s.outputType._M_dataplus._M_p,&shader);
          replaceToken("<FORMAT>",s.format._M_dataplus._M_p,&shader);
          replaceToken("<INPUT_TYPE>",s.inputType._M_dataplus._M_p,&shader);
          replaceToken("<POINT_TYPE>",s.pointType._M_dataplus._M_p,&shader);
          replaceToken("<POINT_DEF>",s.pointDef._M_dataplus._M_p,&shader);
          replaceToken("<RETURN_TYPE>",s.returnType._M_dataplus._M_p,&shader);
          replaceToken("<SAMPLE_DEF>",s.sampleDef._M_dataplus._M_p,&shader);
          replaceToken("<RESULT_EXPECTED>",s.resultExpected._M_dataplus._M_p,&shader);
          replaceToken("<EPSILON>",s.epsilon._M_dataplus._M_p,&shader);
          memset(&sources,0,0xac);
          sources.transformFeedbackVaryings.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
          sources.transformFeedbackVaryings.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_finish._0_1_ = 0;
          sources.transformFeedbackVaryings.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_finish._1_7_ = 0;
          sources.transformFeedbackVaryings.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage._0_1_ = 0;
          sources._193_8_ = 0;
          glu::ComputeSource::ComputeSource((ComputeSource *)&program,&shader);
          glu::ProgramSources::operator<<(&sources,(ShaderSource *)&program);
          std::__cxx11::string::~string
                    ((string *)
                     &program.m_shaders[0].
                      super__Vector_base<glu::Shader_*,_std::allocator<glu::Shader_*>_>._M_impl.
                      super__Vector_impl_data._M_finish);
          glu::ShaderProgram::ShaderProgram
                    (&program,((local_3e0->super_SparseTextureCommitmentTestCase).super_TestCase.
                              m_context)->m_renderCtx,&sources);
          if (program.m_program.m_info.linkOk == true) {
            (*gl->useProgram)(program.m_program.m_program);
            GVar8 = (*gl->getError)();
            glu::checkError(GVar8,"glUseProgram",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cSparseTexture2Tests.cpp"
                            ,0x4dd);
            (*gl->bindImageTexture)(0,verifyTexture,0,'\0',0,0x88b9,0x8232);
            GVar8 = (*gl->getError)();
            glu::checkError(GVar8,"glBindImageTexture",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cSparseTexture2Tests.cpp"
                            ,0x4e4);
            (*gl->bindImageTexture)(1,*texture,local_3ec,'\0',0,35000,(GLenum)local_3d8);
            GVar8 = (*gl->getError)();
            glu::checkError(GVar8,"glBindImageTexture",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cSparseTexture2Tests.cpp"
                            ,0x4eb);
            (*gl->uniform1i)(1,0);
            GVar8 = (*gl->getError)();
            glu::checkError(GVar8,"glUniform1i",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cSparseTexture2Tests.cpp"
                            ,0x4ed);
            (*gl->uniform1i)(2,1);
            GVar8 = (*gl->getError)();
            glu::checkError(GVar8,"glUniform1i",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cSparseTexture2Tests.cpp"
                            ,0x4ef);
            (*gl->dispatchCompute)(width,height,depth);
            GVar8 = (*gl->getError)();
            glu::checkError(GVar8,"glDispatchCompute",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cSparseTexture2Tests.cpp"
                            ,0x4f1);
            (*gl->memoryBarrier)(0xffffffff);
            GVar8 = (*gl->getError)();
            glu::checkError(GVar8,"glMemoryBarrier",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cSparseTexture2Tests.cpp"
                            ,0x4f3);
            gl4cts::Texture::GetData(gl,0,local_408.format,0x1903,0x1401,__s);
            GVar8 = (*gl->getError)();
            glu::checkError(GVar8,"Texture::GetData",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cSparseTexture2Tests.cpp"
                            ,0x4f6);
            uVar15 = 0;
            uVar13 = (ulong)(uint)depth;
            if (depth < 1) {
              uVar13 = uVar15;
            }
            iVar12 = 0;
            if (0 < height) {
              iVar12 = height;
            }
            while (iVar21 = (int)uVar15, iVar21 != iVar7) {
              for (iVar17 = 0; iVar17 != iVar12; iVar17 = iVar17 + 1) {
                iVar18 = (int)uVar15;
                uVar20 = uVar13;
                while (bVar22 = uVar20 != 0, uVar20 = uVar20 - 1, bVar22) {
                  iVar19 = (int)uVar15;
                  if (puVar4[iVar19] != __s[iVar19]) {
                    iVar9 = 0;
                  }
                  uVar15 = (ulong)(uint)(iVar19 + height * width);
                }
                uVar15 = (ulong)(uint)(iVar18 + width);
              }
              uVar15 = (ulong)(iVar21 + 1);
            }
          }
          else {
            poVar10 = std::operator<<(local_3d0,
                                      "Compute shader compilation failed (reading) for target: ");
            poVar10 = (ostream *)std::ostream::operator<<(poVar10,(uint)local_3e8);
            poVar10 = std::operator<<(poVar10,", format: ");
            poVar10 = (ostream *)std::ostream::operator<<(poVar10,(int)local_3d8);
            poVar10 = std::operator<<(poVar10,", infoLog: ");
            poVar10 = std::operator<<(poVar10,(string *)
                                              &((*program.m_shaders[5].
                                                  super__Vector_base<glu::Shader_*,_std::allocator<glu::Shader_*>_>
                                                  ._M_impl.super__Vector_impl_data._M_start)->m_info
                                               ).infoLog);
            poVar10 = std::operator<<(poVar10,", shaderSource: ");
            poVar10 = std::operator<<(poVar10,shader._M_dataplus._M_p);
            std::operator<<(poVar10," - ");
            iVar9 = 0;
          }
          glu::ShaderProgram::~ShaderProgram(&program);
          glu::ProgramSources::~ProgramSources(&sources);
          TokenStrings::~TokenStrings(&s);
          std::__cxx11::string::~string((string *)&shader);
          iVar12 = (GLint)local_3f8 + 1;
        }
        gl4cts::Texture::Delete(gl,&verifyTexture);
        std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
                  (&vecOutData.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>);
        this_02 = (TokenStrings *)&vecExpData;
      }
      else {
        iVar12 = height * width;
        iVar9 = tcu::TextureFormat::getPixelSize(local_3f8);
        s.format._M_dataplus._M_p = (pointer)0x0;
        s.format._M_string_length = 0;
        s.format.field_2._M_allocated_capacity = 0;
        sources.sources[0].
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
        sources.sources[0].
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
        sources.sources[0].
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        sVar14 = (size_type)(GVar1 * iVar9 * iVar12);
        std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
                  ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&s,sVar14);
        std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
                  ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&sources,sVar14);
        _Var6 = s.format._M_dataplus;
        pbVar5 = sources.sources[0].
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        memset(s.format._M_dataplus._M_p,0xff,sVar14);
        memset(pbVar5,0x7f,sVar14);
        gl4cts::Texture::GetData
                  (gl,local_3ec,(uint)local_3e8,local_408.format,(GLenum)local_3e0,pbVar5);
        GVar8 = (*gl->getError)();
        glu::checkError(GVar8,"Texture::GetData",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cSparseTexture2Tests.cpp"
                        ,0x463);
        if (iVar7 < 1) {
          iVar7 = 0;
        }
        bVar22 = true;
        for (iVar9 = 0; iVar9 != iVar7; iVar9 = iVar9 + 1) {
          for (iVar12 = 0; iVar12 < height; iVar12 = iVar12 + 1) {
            for (iVar21 = 0; iVar21 < depth; iVar21 = iVar21 + 1) {
              iVar17 = tcu::TextureFormat::getPixelSize(local_3f8);
              lVar16 = (long)((width * iVar12 + iVar9) * iVar17);
              iVar17 = bcmp(_Var6._M_p + lVar16,(void *)((long)&(pbVar5->_M_dataplus)._M_p + lVar16)
                            ,(long)iVar17);
              if (iVar17 != 0) {
                bVar22 = false;
              }
            }
          }
        }
        std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
                  ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&sources);
        this_02 = &s;
      }
      std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
                ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)this_02);
    }
  }
  return bVar22;
}

Assistant:

bool SparseTexture2CommitmentTestCase::verifyTextureData(const Functions& gl, GLint target, GLint format,
														 GLuint& texture, GLint level)
{
	mLog << "Verify Texture [level: " << level << "] - ";

	if (level > mState.levels - 1)
		TCU_FAIL("Invalid level");

	TransferFormat transferFormat = glu::getTransferFormat(mState.format);

	GLint width;
	GLint height;
	GLint depth;
	SparseTextureUtils::getTextureLevelSize(target, mState, level, width, height, depth);

	//Committed region is limited to 1/2 of width
	GLint widthCommitted = width / 2;

	if (widthCommitted == 0 || height == 0 || depth < mState.minDepth)
		return true;

	bool result = true;

	if (target != GL_TEXTURE_CUBE_MAP && target != GL_TEXTURE_2D_MULTISAMPLE &&
		target != GL_TEXTURE_2D_MULTISAMPLE_ARRAY)
	{
		GLint texSize = width * height * depth * mState.format.getPixelSize();

		std::vector<GLubyte> vecExpData;
		std::vector<GLubyte> vecOutData;
		vecExpData.resize(texSize);
		vecOutData.resize(texSize);
		GLubyte* exp_data = vecExpData.data();
		GLubyte* out_data = vecOutData.data();

		deMemset(exp_data, 255, texSize);
		deMemset(out_data, 127, texSize);

		Texture::GetData(gl, level, target, transferFormat.format, transferFormat.dataType, (GLvoid*)out_data);
		GLU_EXPECT_NO_ERROR(gl.getError(), "Texture::GetData");

		//Verify only committed region
		for (GLint x = 0; x < widthCommitted; ++x)
			for (GLint y = 0; y < height; ++y)
				for (GLint z = 0; z < depth; ++z)
				{
					int		 pixelSize	 = mState.format.getPixelSize();
					GLubyte* dataRegion	= exp_data + ((x + y * width) * pixelSize);
					GLubyte* outDataRegion = out_data + ((x + y * width) * pixelSize);
					if (deMemCmp(dataRegion, outDataRegion, pixelSize) != 0)
						result = false;
				}
	}
	else if (target == GL_TEXTURE_CUBE_MAP)
	{
		std::vector<GLint> subTargets;

		subTargets.push_back(GL_TEXTURE_CUBE_MAP_POSITIVE_X);
		subTargets.push_back(GL_TEXTURE_CUBE_MAP_NEGATIVE_X);
		subTargets.push_back(GL_TEXTURE_CUBE_MAP_POSITIVE_Y);
		subTargets.push_back(GL_TEXTURE_CUBE_MAP_NEGATIVE_Y);
		subTargets.push_back(GL_TEXTURE_CUBE_MAP_POSITIVE_Z);
		subTargets.push_back(GL_TEXTURE_CUBE_MAP_NEGATIVE_Z);

		GLint texSize = width * height * mState.format.getPixelSize();

		std::vector<GLubyte> vecExpData;
		std::vector<GLubyte> vecOutData;
		vecExpData.resize(texSize);
		vecOutData.resize(texSize);
		GLubyte* exp_data = vecExpData.data();
		GLubyte* out_data = vecOutData.data();

		deMemset(exp_data, 255, texSize);

		for (size_t i = 0; i < subTargets.size(); ++i)
		{
			GLint subTarget = subTargets[i];

			mLog << "Verify Subtarget [subtarget: " << subTarget << "] - ";

			deMemset(out_data, 127, texSize);

			Texture::GetData(gl, level, subTarget, transferFormat.format, transferFormat.dataType, (GLvoid*)out_data);
			GLU_EXPECT_NO_ERROR(gl.getError(), "Texture::GetData");

			//Verify only committed region
			for (GLint x = 0; x < widthCommitted; ++x)
				for (GLint y = 0; y < height; ++y)
					for (GLint z = 0; z < depth; ++z)
					{
						int		 pixelSize	 = mState.format.getPixelSize();
						GLubyte* dataRegion	= exp_data + ((x + y * width) * pixelSize);
						GLubyte* outDataRegion = out_data + ((x + y * width) * pixelSize);
						if (deMemCmp(dataRegion, outDataRegion, pixelSize) != 0)
							result = false;
					}

			if (!result)
				break;
		}
	}
	// For multisample texture use compute shader to verify image data
	else if (target == GL_TEXTURE_2D_MULTISAMPLE || target == GL_TEXTURE_2D_MULTISAMPLE_ARRAY)
	{
		GLint texSize = width * height * depth;

		std::vector<GLubyte> vecExpData;
		std::vector<GLubyte> vecOutData;
		vecExpData.resize(texSize);
		vecOutData.resize(texSize);
		GLubyte* exp_data = vecExpData.data();
		GLubyte* out_data = vecOutData.data();

		deMemset(exp_data, 255, texSize);

		// Create verifying texture
		GLint verifyTarget;
		if (target == GL_TEXTURE_2D_MULTISAMPLE)
			verifyTarget = GL_TEXTURE_2D;
		else
			verifyTarget = GL_TEXTURE_2D_ARRAY;

		GLuint verifyTexture;
		Texture::Generate(gl, verifyTexture);
		Texture::Bind(gl, verifyTexture, verifyTarget);
		Texture::Storage(gl, verifyTarget, 1, GL_R8, width, height, depth);
		GLU_EXPECT_NO_ERROR(gl.getError(), "Texture::Storage");

		for (int sample = 0; sample < mState.samples; ++sample)
		{
			deMemset(out_data, 0, texSize);

			Texture::Bind(gl, verifyTexture, verifyTarget);
			Texture::SubImage(gl, verifyTarget, 0, 0, 0, 0, width, height, depth, GL_RED, GL_UNSIGNED_BYTE,
							  (GLvoid*)out_data);
			GLU_EXPECT_NO_ERROR(gl.getError(), "Texture::SubImage");

			std::string shader = st2_compute_textureVerify;

			// Adjust shader source to texture format
			TokenStrings s = createShaderTokens(target, format, sample);

			replaceToken("<OUTPUT_TYPE>", s.outputType.c_str(), shader);
			replaceToken("<FORMAT>", s.format.c_str(), shader);
			replaceToken("<INPUT_TYPE>", s.inputType.c_str(), shader);
			replaceToken("<POINT_TYPE>", s.pointType.c_str(), shader);
			replaceToken("<POINT_DEF>", s.pointDef.c_str(), shader);
			replaceToken("<RETURN_TYPE>", s.returnType.c_str(), shader);
			replaceToken("<SAMPLE_DEF>", s.sampleDef.c_str(), shader);
			replaceToken("<RESULT_EXPECTED>", s.resultExpected.c_str(), shader);
			replaceToken("<EPSILON>", s.epsilon.c_str(), shader);

			ProgramSources sources;
			sources << ComputeSource(shader);

			// Build and run shader
			ShaderProgram program(m_context.getRenderContext(), sources);
			if (program.isOk())
			{
				gl.useProgram(program.getProgram());
				GLU_EXPECT_NO_ERROR(gl.getError(), "glUseProgram");
				gl.bindImageTexture(0, //unit
									verifyTexture,
									0,		  //level
									GL_FALSE, //layered
									0,		  //layer
									GL_WRITE_ONLY, GL_R8UI);
				GLU_EXPECT_NO_ERROR(gl.getError(), "glBindImageTexture");
				gl.bindImageTexture(1, //unit
									texture,
									level,	//level
									GL_FALSE, //layered
									0,		  //layer
									GL_READ_ONLY, format);
				GLU_EXPECT_NO_ERROR(gl.getError(), "glBindImageTexture");
				gl.uniform1i(1, 0 /* image_unit */);
				GLU_EXPECT_NO_ERROR(gl.getError(), "glUniform1i");
				gl.uniform1i(2, 1 /* image_unit */);
				GLU_EXPECT_NO_ERROR(gl.getError(), "glUniform1i");
				gl.dispatchCompute(width, height, depth);
				GLU_EXPECT_NO_ERROR(gl.getError(), "glDispatchCompute");
				gl.memoryBarrier(GL_ALL_BARRIER_BITS);
				GLU_EXPECT_NO_ERROR(gl.getError(), "glMemoryBarrier");

				Texture::GetData(gl, 0, verifyTarget, GL_RED, GL_UNSIGNED_BYTE, (GLvoid*)out_data);
				GLU_EXPECT_NO_ERROR(gl.getError(), "Texture::GetData");

				//Verify only committed region
				for (GLint x = 0; x < widthCommitted; ++x)
					for (GLint y = 0; y < height; ++y)
						for (GLint z = 0; z < depth; ++z)
						{
							GLubyte* dataRegion	= exp_data + ((x + y * width) + z * width * height);
							GLubyte* outDataRegion = out_data + ((x + y * width) + z * width * height);
							if (dataRegion[0] != outDataRegion[0])
								result = false;
						}
			}
			else
			{
				mLog << "Compute shader compilation failed (reading) for target: " << target << ", format: " << format
					 << ", infoLog: " << program.getShaderInfo(SHADERTYPE_COMPUTE).infoLog
					 << ", shaderSource: " << shader.c_str() << " - ";

				result = false;
			}
		}

		Texture::Delete(gl, verifyTexture);
	}

	return result;
}